

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::_populateCalledFunctions(LazyLLVMCallGraph *this,Function *fun)

{
  bool bVar1;
  const_iterator C_00;
  ret_type pCVar2;
  LazyLLVMCallGraph *in_RSI;
  Instruction *in_RDI;
  CallInst *C;
  Instruction *I;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *B;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Function *in_stack_ffffffffffffff98;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_48;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_40;
  reference local_38;
  reference local_30;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_28;
  
  C_00 = llvm::Function::begin(in_stack_ffffffffffffff98);
  local_28.NodePtr = (node_pointer)llvm::Function::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = llvm::operator!=((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)&stack0xffffffffffffffe0,&local_28);
    if (!bVar1) break;
    local_38 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                            *)0x18e022);
    local_30 = local_38;
    local_40.NodePtr =
         (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_ffffffffffffff98);
    local_48.NodePtr = (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = llvm::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
      ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                   *)0x18e06e);
      pCVar2 = llvm::dyn_cast<llvm::CallInst,llvm::Instruction_const>(in_RDI);
      if (pCVar2 != (ret_type)0x0) {
        getCalledFunctions(in_RSI,(CallInst *)C_00.NodePtr);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                    *)in_RDI);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                  *)in_RDI);
  }
  return;
}

Assistant:

void _populateCalledFunctions(const llvm::Function *fun) {
        for (auto &B : *fun) {
            for (auto &I : B) {
                if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                    getCalledFunctions(C);
                }
            }
        }
    }